

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.cpp
# Opt level: O0

Texture * rw::Texture::streamReadNative(Stream *stream)

{
  FILE *__stream;
  bool bVar1;
  uint32 uVar2;
  char *pcVar3;
  uint32 local_20;
  uint32 platform;
  Error _e;
  Stream *stream_local;
  
  _e = (Error)stream;
  bVar1 = findChunk(stream,1,(uint32 *)0x0,(uint32 *)0x0);
  if (bVar1) {
    uVar2 = Stream::readU32((Stream *)_e);
    (**(code **)(*(long *)_e + 0x28))(_e,0xfffffff0,1);
    if (uVar2 == 0x325350) {
      stream_local = (Stream *)ps2::readNativeTexture((Stream *)_e);
    }
    else if (uVar2 == 8) {
      stream_local = (Stream *)d3d8::readNativeTexture((Stream *)_e);
    }
    else if (uVar2 == 9) {
      stream_local = (Stream *)d3d9::readNativeTexture((Stream *)_e);
    }
    else if (uVar2 == 5) {
      stream_local = (Stream *)xbox::readNativeTexture((Stream *)_e);
    }
    else if (uVar2 == 0xc) {
      stream_local = (Stream *)gl3::readNativeTexture((Stream *)_e);
    }
    else {
      stream_local = (Stream *)0x0;
    }
  }
  else {
    local_20 = 0;
    platform = 0x80000004;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/texture.cpp"
            ,0x1d5);
    __stream = _stderr;
    pcVar3 = dbgsprint(0x80000004,"STRUCT");
    fprintf(__stream,"%s\n",pcVar3);
    setError((Error *)&stack0xffffffffffffffe0);
    stream_local = (Stream *)0x0;
  }
  return (Texture *)stream_local;
}

Assistant:

Texture*
Texture::streamReadNative(Stream *stream)
{
	if(!findChunk(stream, ID_STRUCT, nil, nil)){
		RWERROR((ERR_CHUNK, "STRUCT"));
		return nil;
	}
	uint32 platform = stream->readU32();
	stream->seek(-16);
	if(platform == FOURCC_PS2)
		return ps2::readNativeTexture(stream);
	if(platform == PLATFORM_D3D8)
		return d3d8::readNativeTexture(stream);
	if(platform == PLATFORM_D3D9)
		return d3d9::readNativeTexture(stream);
	if(platform == PLATFORM_XBOX)
		return xbox::readNativeTexture(stream);
	if(platform == PLATFORM_GL3)
		return gl3::readNativeTexture(stream);
	assert(0 && "unsupported platform");
	return nil;
}